

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  CppType CVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue",
               "Field is singular; the method requires a repeated field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
  }
  if (((byte)field[1] & 8) == 0) {
    piVar4 = GetRepeatedField<int>(this,message,field,index);
    return *piVar4;
  }
  uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  iVar3 = internal::ExtensionSet::GetRepeatedEnum
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                     *(int *)(field + 4),index);
  return iVar3;
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}